

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_substr_compare(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  sxu32 sVar2;
  int iVar3;
  sxi32 iValue;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  sxu32 SLen;
  int nSrcLen;
  char *local_40;
  int nSublen;
  
  if ((((nArg < 3) || (pcVar4 = jx9_value_to_string(*apArg,&nSrcLen), nSrcLen < 1)) ||
      (pcVar5 = jx9_value_to_string(apArg[1],&nSublen), nSublen < 1)) || (nSrcLen < nSublen)) {
LAB_0012a94d:
    jx9_result_bool(pCtx,0);
    return 0;
  }
  local_40 = pcVar5;
  uVar1 = jx9_value_to_int(apArg[2]);
  if ((int)uVar1 < 0) {
    uVar6 = nSrcLen + uVar1;
    iVar3 = 0;
    if ((int)uVar6 < 0) goto LAB_0012a94d;
  }
  else {
    iVar3 = nSrcLen;
    uVar6 = uVar1;
    if (nSrcLen <= (int)uVar1) goto LAB_0012a94d;
  }
  if (nArg == 3) {
    SLen = iVar3 - uVar1;
  }
  else {
    sVar2 = jx9_value_to_int(apArg[3]);
    if ((int)sVar2 < 1) {
      iValue = 1;
      goto LAB_0012a9e2;
    }
    SLen = nSrcLen - uVar6;
    if ((int)(sVar2 + uVar6) <= nSrcLen) {
      SLen = sVar2;
    }
    if ((4 < (uint)nArg) && (iVar3 = jx9_value_to_bool(apArg[4]), iVar3 != 0)) {
      iValue = SyStrnicmp(pcVar4 + uVar6,local_40,SLen);
      goto LAB_0012a9e2;
    }
  }
  iValue = SyStrncmp(pcVar4 + uVar6,local_40,SLen);
LAB_0012a9e2:
  jx9_result_int(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_substr_compare(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zSource, *zOfft, *zSub;
	int nOfft, nLen, nSrcLen, nSublen;
	int iCase = 0;
	int rc;
	if( nArg < 3 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zSource = jx9_value_to_string(apArg[0], &nSrcLen);
	if( nSrcLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = nSrcLen; /* cc warning */
	/* Extract the substring */
	zSub = jx9_value_to_string(apArg[1], &nSublen);
	if( nSublen < 1 || nSublen > nSrcLen){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the offset */
	nOfft = jx9_value_to_int(apArg[2]);
	if( nOfft < 0 ){
		zOfft = &zSource[nSrcLen+nOfft]; 
		if( zOfft < zSource ){
			/* Invalid offset */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nLen = (int)(&zSource[nSrcLen]-zOfft);
		nOfft = (int)(zOfft-zSource);
	}else if( nOfft >= nSrcLen ){
		/* Invalid offset */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}else{
		zOfft = &zSource[nOfft];
		nLen = nSrcLen - nOfft;
	}
	if( nArg > 3 ){
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 1 ){
			/* Invalid  length */
			jx9_result_int(pCtx, 1);
			return JX9_OK;
		}else if( nLen + nOfft > nSrcLen ){
			/* Invalid length */
			nLen = nSrcLen - nOfft;
		}
		if( nArg > 4 ){
			/* Case-sensitive or not */
			iCase = jx9_value_to_bool(apArg[4]);
		}
	}
	/* Perform the comparison */
	if( iCase ){
		rc = SyStrnicmp(zOfft, zSub, (sxu32)nLen);
	}else{
		rc = SyStrncmp(zOfft, zSub, (sxu32)nLen);
	}
	/* Comparison result */
	jx9_result_int(pCtx, rc);
	return JX9_OK;
}